

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O3

ps_search_t * state_align_search_init(char *name,cmd_ln_t *config,acmod_t *acmod,ps_alignment_t *al)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ps_search_t *search;
  ps_searchfuncs_t *ppVar4;
  ps_alignment_t *ppVar5;
  char *pcVar6;
  ps_search_t *ppVar7;
  cmd_ln_t *pcVar8;
  ps_alignment_iter_t *itor;
  ps_alignment_entry_t *ppVar9;
  ulong uVar10;
  long lVar11;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0xb8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                          ,0x1b6);
  ps_search_init(search,&state_align_search_funcs,"state_align",name,config,acmod,al->d2p->dict,
                 al->d2p);
  ppVar4 = (ps_searchfuncs_t *)
           hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  search[1].vt = ppVar4;
  if (ppVar4 == (ps_searchfuncs_t *)0x0) {
    ckd_free(search);
    search = (ps_search_t *)0x0;
  }
  else {
    ppVar5 = ps_alignment_retain(al);
    search[1].type = (char *)ppVar5;
    uVar2 = (al->sseq).n_ent;
    *(uint *)&search[1].acmod = (uint)uVar2;
    *(uint *)((long)&search[1].dict + 4) = (uint)(al->state).n_ent;
    pcVar6 = (char *)__ckd_calloc__((ulong)uVar2,0x58,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                    ,0x1c5);
    search[1].name = pcVar6;
    ppVar7 = (ps_search_t *)
             __ckd_calloc__((long)*(int *)&search[1].acmod,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                            ,0x1c6);
    search[1].pls = ppVar7;
    pcVar8 = (cmd_ln_t *)
             __ckd_calloc__((long)*(int *)&search[1].acmod,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                            ,0x1c7);
    search[1].config = pcVar8;
    itor = ps_alignment_phones(al);
    if (itor != (ps_alignment_iter_t *)0x0 && 0 < *(int *)&search[1].acmod) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        ppVar9 = ps_alignment_iter_get(itor);
        hmm_init((hmm_context_t *)search[1].vt,(hmm_t *)(search[1].name + lVar11),0,
                 (uint)(ppVar9->id).pid.ssid,(ppVar9->id).pid.tmatid);
        bVar1 = search[1].name[lVar11 + 0x51];
        if (ppVar9->duration < (int)(uint)bVar1) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                  ,0x1d5,
                  "phone %d has impossible duration %d (consider disabling bestpath search)\n",
                  uVar10 & 0xffffffff);
        }
        iVar3 = ppVar9->start;
        if ((iVar3 < 1) || (ppVar9->duration < (int)(uint)bVar1)) {
          iVar3 = 0;
        }
        *(int *)((long)&(search[1].pls)->vt + uVar10 * 4) = iVar3;
        iVar3 = 0x7fffffff;
        if ((int)(uint)bVar1 <= ppVar9->duration) {
          iVar3 = ppVar9->duration + ppVar9->start;
        }
        (&(search[1].config)->refcount)[uVar10] = iVar3;
        uVar10 = uVar10 + 1;
        itor = ps_alignment_iter_next(itor);
      } while (((long)uVar10 < (long)*(int *)&search[1].acmod) &&
              (lVar11 = lVar11 + 0x58, itor != (ps_alignment_iter_t *)0x0));
    }
  }
  return search;
}

Assistant:

ps_search_t *
state_align_search_init(const char *name,
                        cmd_ln_t *config,
                        acmod_t *acmod,
                        ps_alignment_t *al)
{
    state_align_search_t *sas;
    ps_alignment_iter_t *itor;
    int i;

    sas = ckd_calloc(1, sizeof(*sas));
    ps_search_init(ps_search_base(sas), &state_align_search_funcs,
		   PS_SEARCH_TYPE_STATE_ALIGN, name,
                   config, acmod, al->d2p->dict, al->d2p);
    sas->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (sas->hmmctx == NULL) {
        ckd_free(sas);
        return NULL;
    }
    sas->al = ps_alignment_retain(al);

    /* Generate HMM vector from phone level of alignment. */
    sas->n_phones = ps_alignment_n_phones(al);
    sas->n_emit_state = ps_alignment_n_states(al);
    sas->hmms = ckd_calloc(sas->n_phones, sizeof(*sas->hmms));
    sas->sf = ckd_calloc(sas->n_phones, sizeof(*sas->sf));
    sas->ef = ckd_calloc(sas->n_phones, sizeof(*sas->ef));
    for (i = 0, itor = ps_alignment_phones(al);
         i < sas->n_phones && itor;
         ++i, itor = ps_alignment_iter_next(itor)) {
        ps_alignment_entry_t *ent = ps_alignment_iter_get(itor);
        int min_nframes;
        
        hmm_init(sas->hmmctx, &sas->hmms[i], FALSE,
                 ent->id.pid.ssid, ent->id.pid.tmatid);
        /* Can't align less than the number of frames in an HMM! */
        min_nframes = hmm_n_emit_state(&sas->hmms[i]);
        if (ent->duration < min_nframes)
            E_WARN("phone %d has impossible duration %d "
                   "(consider disabling bestpath search)\n",
                   i, ent->duration);
        if (ent->start > 0 && ent->duration >= min_nframes)
            sas->sf[i] = ent->start;
        else
            sas->sf[i] = 0; /* Always active */
        if (ent->duration >= min_nframes)
            sas->ef[i] = ent->start + ent->duration;
        else
            sas->ef[i] = INT_MAX; /* Always active */
    }
    return ps_search_base(sas);
}